

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.h
# Opt level: O0

size_t bin_text_read_write_fixed_validated
                 (io_buf *io,char *data,size_t len,char *read_message,bool read,stringstream *msg,
                 bool text)

{
  undefined8 uVar1;
  undefined8 in_RCX;
  stringstream *in_RDX;
  string *in_RSI;
  byte in_R8B;
  byte in_stack_00000008;
  stringstream __msg;
  size_t nbytes;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  int plineNumber;
  char *in_stack_fffffffffffffe08;
  vw_exception *in_stack_fffffffffffffe10;
  io_buf *in_stack_fffffffffffffe18;
  stringstream local_1c8 [16];
  ostream local_1b8;
  size_t local_40;
  byte local_31;
  byte local_21;
  stringstream *local_18;
  
  local_21 = in_R8B & 1;
  local_31 = in_stack_00000008 & 1;
  local_18 = in_RDX;
  local_40 = bin_text_read_write_fixed
                       (in_stack_fffffffffffffe18,(char *)in_stack_fffffffffffffe10,
                        (size_t)in_stack_fffffffffffffe08,
                        (char *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                        SUB81((ulong)in_RSI >> 0x38,0),in_RDX,SUB81((ulong)in_RCX >> 0x38,0));
  if ((((local_21 & 1) != 0) && (local_18 != (stringstream *)0x0)) && (local_40 == 0)) {
    std::__cxx11::stringstream::stringstream(local_1c8);
    std::operator<<(&local_1b8,"Unexpected end of file encountered.");
    plineNumber = CONCAT13(1,(int3)in_stack_fffffffffffffe04);
    uVar1 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,plineNumber,in_RSI);
    __cxa_throw(uVar1,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  return local_40;
}

Assistant:

inline size_t bin_text_read_write_fixed_validated(
    io_buf& io, char* data, size_t len, const char* read_message, bool read, std::stringstream& msg, bool text)
{
  size_t nbytes = bin_text_read_write_fixed(io, data, len, read_message, read, msg, text);
  if (read && len > 0)  // only validate bytes read/write if expected length > 0
  {
    if (nbytes == 0)
    {
      THROW("Unexpected end of file encountered.");
    }
  }
  return nbytes;
}